

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void remove_aug(lys_node_augment *augment)

{
  lys_node *plVar1;
  lys_node *elem;
  lys_node *last;
  lys_node_augment *augment_local;
  
  if ((augment->target != (lys_node *)0x0) && ((augment->flags & 1) == 0)) {
    plVar1 = augment->child;
    elem = plVar1;
    if (plVar1 != (lys_node *)0x0) {
      while (((elem != (lys_node *)0x0 && (elem->next != (lys_node *)0x0)) &&
             (elem->next->parent == (lys_node *)augment))) {
        elem = elem->next;
      }
      if (augment->target->child == plVar1) {
        augment->target->child = elem->next;
      }
      if (plVar1->prev->next != (lys_node *)0x0) {
        plVar1->prev->next = elem->next;
      }
      if (elem->next == (lys_node *)0x0) {
        if (augment->target->child != (lys_node *)0x0) {
          augment->target->child->prev = plVar1->prev;
        }
      }
      else {
        elem->next->prev = plVar1->prev;
      }
      plVar1->prev = elem;
      elem->next = (lys_node *)0x0;
    }
    augment->flags = augment->flags | 1;
  }
  return;
}

Assistant:

static void
remove_aug(struct lys_node_augment *augment)
{
    struct lys_node *last, *elem;

    if (!augment->target || (augment->flags & LYS_NOTAPPLIED)) {
        /* skip not resolved augments OR already not applied augment */
        return;
    }

    elem = augment->child;
    if (elem) {
        LY_TREE_FOR(elem, last) {
            if (!last->next || (last->next->parent != (struct lys_node *)augment)) {
                break;
            }
        }
        /* elem is first augment child, last is the last child */

        /* parent child ptr */
        if (augment->target->child == elem) {
            augment->target->child = last->next;
        }

        /* parent child next ptr */
        if (elem->prev->next) {
            elem->prev->next = last->next;
        }

        /* parent child prev ptr */
        if (last->next) {
            last->next->prev = elem->prev;
        } else if (augment->target->child) {
            augment->target->child->prev = elem->prev;
        }

        /* update augment children themselves */
        elem->prev = last;
        last->next = NULL;
    }

    /* augment->target still keeps the resolved target, but for lys_augment_free()
     * we have to keep information that this augment is not applied to free its data */
    augment->flags |= LYS_NOTAPPLIED;
}